

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

int __thiscall cvm::BasicValue::toInt(BasicValue *this)

{
  BasicValue *this_local;
  
  switch(this->Type) {
  case BoolType:
    this_local._4_4_ = (uint)((this->field_2).BoolVal & 1);
    break;
  case IntType:
    this_local._4_4_ = (this->field_2).IntVal;
    break;
  case DoubleType:
    this_local._4_4_ = (uint)(this->field_2).DoubleVal;
    break;
  case StringType:
    this_local._4_4_ = std::__cxx11::stoi(&this->StrVal,(size_t *)0x0,10);
    break;
  default:
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int BasicValue::toInt() const {
  switch (Type) {
  default:          return 0;
  case IntType:     return IntVal;
  case DoubleType:  return static_cast<int>(DoubleVal);
  case BoolType:    return BoolVal;
  case StringType:  return std::stoi(StrVal);
  }
}